

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variant.hpp
# Opt level: O0

void type_safe::
     with<type_safe::optional_variant_policy,int,double,debugger_type,C_A_T_C_H_T_E_S_T_0()::visitor&>
               (basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type>
                *variant,visitor *func)

{
  variant_storage<type_safe::optional_variant_policy,_int,_double,_debugger_type> *this;
  tagged_union<int,_double,_debugger_type> *u;
  visitor *func_local;
  basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type> *variant_local;
  
  this = detail::storage_access::
         get<type_safe::basic_variant<type_safe::optional_variant_policy,int,double,debugger_type>>
                   (variant);
  u = detail::variant_storage<type_safe::optional_variant_policy,_int,_double,_debugger_type>::
      get_union(this);
  with<int,double,debugger_type,C_A_T_C_H_T_E_S_T_0()::visitor&>(u,func);
  return;
}

Assistant:

void with(basic_variant<VariantPolicy, Head, Types...>& variant, Func&& func,
          Args&&... additional_args)
{
    with(detail::storage_access::get(variant).get_union(), std::forward<Func>(func),
         std::forward<Args>(additional_args)...);
}